

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O0

bool __thiscall
gmlc::containers::
DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>::
addSearchTerm(DualStringMappedVector<helics::FedInfo,_helics::GlobalFederateId,_(reference_stability)0,_5>
              *this,GlobalFederateId *searchValue,string_view existingValue)

{
  bool bVar1;
  GlobalFederateId *in_RSI;
  unordered_map<helics::GlobalFederateId,_unsigned_long,_std::hash<helics::GlobalFederateId>,_std::equal_to<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_unsigned_long>_>_>
  *in_RDI;
  pair<std::__detail::_Node_iterator<std::pair<const_helics::GlobalFederateId,_unsigned_long>,_false,_false>,_bool>
  pVar2;
  pair<std::__detail::_Node_iterator<std::pair<const_helics::GlobalFederateId,_unsigned_long>,_false,_false>,_bool>
  res;
  iterator fnd;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffff88;
  size_t *__args_1;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
  local_38;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
  local_30;
  GlobalFederateId *local_28;
  bool local_1;
  
  local_28 = in_RSI;
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
       ::find(in_stack_ffffffffffffff88,(key_type *)0x556c00);
  local_38._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffff88);
  bVar1 = std::__detail::operator==(&local_30,&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_1 = false;
  }
  else {
    __args_1 = &in_RDI[2]._M_h._M_rehash_policy._M_next_resize;
    std::__detail::
    _Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_false,_true>
                  *)0x556c53);
    pVar2 = std::
            unordered_map<helics::GlobalFederateId,unsigned_long,std::hash<helics::GlobalFederateId>,std::equal_to<helics::GlobalFederateId>,std::allocator<std::pair<helics::GlobalFederateId_const,unsigned_long>>>
            ::emplace<helics::GlobalFederateId_const&,unsigned_long&>(in_RDI,local_28,__args_1);
    local_1 = (bool)(pVar2.second & 1);
  }
  return local_1;
}

Assistant:

auto addSearchTerm(
            const searchType2& searchValue,
            std::string_view existingValue)
        {
            auto fnd = lookup1.find(existingValue);
            if (fnd != lookup1.end()) {
                auto res = lookup2.emplace(searchValue, fnd->second);
                return res.second;
            }
            return false;
        }